

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall
leveldb::FilterBlockBuilder::StartBlock(FilterBlockBuilder *this,uint64_t block_offset)

{
  size_type sVar1;
  uint64_t filter_index;
  uint64_t block_offset_local;
  FilterBlockBuilder *this_local;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->filter_offsets_);
  if (block_offset >> 0xb < sVar1) {
    __assert_fail("filter_index >= filter_offsets_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/filter_block.cc"
                  ,0x17,"void leveldb::FilterBlockBuilder::StartBlock(uint64_t)");
  }
  while (sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           (&this->filter_offsets_), sVar1 < block_offset >> 0xb) {
    GenerateFilter(this);
  }
  return;
}

Assistant:

void FilterBlockBuilder::StartBlock(uint64_t block_offset) {
  uint64_t filter_index = (block_offset / kFilterBase);
  assert(filter_index >= filter_offsets_.size());
  while (filter_index > filter_offsets_.size()) {
    GenerateFilter();
  }
}